

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3UpdateMethod(sqlite3_vtab *pVtab,int nArg,sqlite3_value **apVal,sqlite_int64 *pRowid)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  sqlite3_mutex *psVar7;
  Fts3SegReader **ppFVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  byte *pbVar12;
  u32 *puVar13;
  ulong uVar14;
  u64 uVar15;
  sqlite_int64 *psVar16;
  u32 *puVar17;
  Mem *pMVar18;
  i64 iVar19;
  uchar *puVar20;
  long lVar21;
  Vdbe *p;
  sqlite3_value *psVar22;
  char *pcVar23;
  Fts3Index *pFVar24;
  u32 *pnWord;
  byte *pbVar25;
  byte *pbVar26;
  long lVar27;
  char *pcVar28;
  byte *pbVar29;
  Vdbe *pStmt;
  int iVar30;
  Fts3Table *pFVar31;
  sqlite3_stmt *pStmt_00;
  bool bVar32;
  int rc;
  int rc_1;
  int nChng;
  i64 iCol;
  int iDum1;
  i64 iDocid;
  sqlite3_stmt *pAllLangid;
  int iDum2;
  Fts3MultiSegReader csr;
  int local_134;
  Fts3Table *local_130;
  sqlite_int64 *local_128;
  u32 *local_120;
  Fts3SegFilter local_118;
  int local_fc;
  ulong local_f8;
  ulong local_f0;
  char *local_e8;
  int local_e0;
  int local_dc;
  sqlite_int64 *local_d8;
  long local_d0;
  sqlite3_stmt *local_c8;
  int local_bc;
  Fts3MultiSegReader local_b8;
  sqlite3_tokenizer_module *local_60;
  Vdbe *local_58;
  long local_50;
  long local_48;
  sqlite3_tokenizer_cursor *local_40;
  i64 local_38;
  
  local_134 = 0;
  local_fc = 0;
  local_130 = (Fts3Table *)pVtab;
  if (nArg < 2) {
LAB_001b9d60:
    iVar11 = *(int *)&pVtab[2].pModule;
    iVar10 = sqlite3_initialize();
    if (iVar10 == 0) {
      puVar17 = (u32 *)sqlite3Malloc((long)iVar11 * 8 + 8);
    }
    else {
      puVar17 = (u32 *)0x0;
    }
    pFVar31 = local_130;
    if (puVar17 != (u32 *)0x0) {
      iVar11 = local_130->nColumn;
      iVar10 = 0;
      local_128 = pRowid;
      memset(puVar17,0,(long)iVar11 * 8 + 8);
      if ((pFVar31->nPendingData == 0) &&
         (iVar10 = fts3SqlStmt(local_130,0x10,(sqlite3_stmt **)&local_b8,(sqlite3_value **)0x0),
         ppFVar8 = local_b8.apSegment, iVar10 == 0)) {
        iVar10 = vdbeUnbind((Vdbe *)local_b8.apSegment,1);
        if ((iVar10 == 0) &&
           (psVar7 = (*(sqlite3 **)ppFVar8)->mutex, psVar7 != (sqlite3_mutex *)0x0)) {
          (*sqlite3Config.mutex.xMutexLeave)(psVar7);
        }
        sqlite3_step((sqlite3_stmt *)ppFVar8);
        iVar10 = sqlite3_reset((sqlite3_stmt *)ppFVar8);
      }
      local_134 = iVar10;
      if (iVar10 != 0) goto LAB_001bad5f;
      bVar32 = true;
      if ((1 < nArg) && (local_130->zContentTbl == (char *)0x0)) {
        psVar22 = apVal[(long)local_130->nColumn + 3];
        uVar3._0_2_ = psVar22->flags;
        uVar3._2_1_ = psVar22->enc;
        uVar3._3_1_ = psVar22->eSubtype;
        if ((0xaaaaaaaaU >> (uVar3 & 0x1f) & 1) != 0) {
          psVar22 = apVal[1];
        }
        uVar4._0_2_ = psVar22->flags;
        uVar4._2_1_ = psVar22->enc;
        uVar4._3_1_ = psVar22->eSubtype;
        if ((0xaaaaaaaaU >> (uVar4 & 0x1f) & 1) == 0) {
          pMVar18 = *apVal;
          uVar5._0_2_ = pMVar18->flags;
          uVar5._2_1_ = pMVar18->enc;
          uVar5._3_1_ = pMVar18->eSubtype;
          if ((0xaaaaaaaaU >> (uVar5 & 0x1f) & 1) == 0) {
            local_120 = (u32 *)sqlite3VdbeIntValue(pMVar18);
            puVar13 = (u32 *)sqlite3VdbeIntValue(psVar22);
            if (local_120 == puVar13) goto LAB_001ba3ed;
          }
          if (local_130->db->vtabOnConflict == '\x05') {
            local_134 = fts3DeleteByRowid(local_130,psVar22,&local_fc,puVar17);
          }
          else {
            local_134 = fts3InsertData(local_130,apVal,local_128);
            bVar32 = false;
          }
        }
      }
LAB_001ba3ed:
      if (local_134 == 0) {
        psVar22 = *apVal;
        uVar6._0_2_ = psVar22->flags;
        uVar6._2_1_ = psVar22->enc;
        uVar6._3_1_ = psVar22->eSubtype;
        if ((0xaaaaaaaaU >> (uVar6 & 0x1f) & 1) == 0) {
          local_134 = fts3DeleteByRowid(local_130,psVar22,&local_fc,puVar17);
        }
        pFVar31 = local_130;
        puVar13 = puVar17 + (long)iVar11 + 1;
        if ((1 < nArg) && (local_134 == 0)) {
          iVar19 = sqlite3VdbeIntValue(apVal[(long)local_130->nColumn + 4]);
          if ((bVar32) &&
             ((local_134 = fts3InsertData(pFVar31,apVal,local_128), local_134 == 0x13 &&
              (pFVar31->zContentTbl == (char *)0x0)))) {
            local_134 = 0x10b;
          }
          if (local_134 == 0) {
            local_134 = fts3PendingTermsDocid(local_130,0,(int)iVar19,*local_128);
          }
          if (local_134 == 0) {
            local_134 = fts3InsertTerms(local_130,(int)iVar19,apVal,puVar13);
          }
          if (local_130->bHasDocsize != '\0') {
            fts3InsertDocsize(&local_134,local_130,puVar13);
          }
          local_fc = local_fc + 1;
        }
        if (local_130->bFts4 != '\0') {
          fts3UpdateDocTotals(&local_134,local_130,puVar13,puVar17,local_fc);
        }
      }
      goto LAB_001bad5f;
    }
    local_134 = 7;
    iVar11 = local_134;
  }
  else {
    psVar22 = *apVal;
    uVar1._0_2_ = psVar22->flags;
    uVar1._2_1_ = psVar22->enc;
    uVar1._3_1_ = psVar22->eSubtype;
    if (((0xaaaaaaaaU >> (uVar1 & 0x1f) & 1) == 0) ||
       (psVar22 = apVal[(long)*(int *)&pVtab[2].pModule + 2], uVar2._0_2_ = psVar22->flags,
       uVar2._2_1_ = psVar22->enc, uVar2._3_1_ = psVar22->eSubtype,
       (0xaaaaaaaaU >> (uVar2 & 0x1f) & 1) != 0)) {
      iVar19 = sqlite3VdbeIntValue(apVal[(long)*(int *)&pVtab[2].pModule + 4]);
      if (-1 < (int)iVar19) goto LAB_001b9d60;
      local_134 = 0x13;
      iVar11 = local_134;
    }
    else {
      pbVar12 = (byte *)sqlite3ValueText(psVar22,'\x01');
      iVar10 = sqlite3ValueBytes(psVar22,'\x01');
      pFVar31 = local_130;
      if (pbVar12 == (byte *)0x0) {
        iVar11 = 7;
      }
      else {
        if (iVar10 == 7) {
          lVar21 = 7;
          lVar27 = 0;
          pcVar28 = "rebuild";
          pbVar25 = pbVar12;
          do {
            if ((ulong)*pbVar25 == 0) {
              pcVar28 = "rebuild" + lVar27;
              goto LAB_001b9f79;
            }
            if (""[*pbVar25] != ""[(byte)*pcVar28]) goto LAB_001b9f79;
            pbVar25 = pbVar25 + 1;
            lVar27 = lVar27 + 1;
            pcVar28 = (char *)((byte *)pcVar28 + 1);
            lVar21 = lVar21 + -1;
          } while (lVar21 != 0);
          lVar21 = 0;
          pbVar25 = pbVar12 + 7;
          pcVar28 = (char *)(byte *)0x1e484b;
LAB_001b9f79:
          if (((int)lVar21 < 1) || (""[*pbVar25] == ""[(byte)*pcVar28])) {
            iVar11 = fts3DeleteAll(local_130,0);
            local_118.zTerm = (char *)CONCAT44(local_118.zTerm._4_4_,iVar11);
            if (iVar11 == 0) {
              local_b8.apSegment = (Fts3SegReader **)0x0;
              pcVar28 = sqlite3_mprintf("SELECT %s");
              if (pcVar28 == (char *)0x0) {
                local_118.zTerm = (char *)CONCAT44(local_118.zTerm._4_4_,7);
              }
              else {
                iVar11 = sqlite3LockAndPrepare
                                   (pFVar31->db,pcVar28,-1,0x80,(Vdbe *)0x0,
                                    (sqlite3_stmt **)&local_b8,(char **)0x0);
                local_118.zTerm = (char *)CONCAT44(local_118.zTerm._4_4_,iVar11);
                sqlite3_free(pcVar28);
              }
              if ((int)local_118.zTerm == 0) {
                local_128 = (sqlite_int64 *)0x0;
                uVar15 = (long)pFVar31->nColumn * 0xc + 0xc;
                iVar11 = sqlite3_initialize();
                if (iVar11 == 0) {
                  puVar17 = (u32 *)sqlite3Malloc(uVar15);
                }
                else {
                  puVar17 = (u32 *)0x0;
                }
                if (puVar17 == (u32 *)0x0) {
                  local_118.zTerm = (char *)CONCAT44(local_118.zTerm._4_4_,7);
                  local_120 = (u32 *)0x0;
                  puVar13 = (u32 *)0x0;
                }
                else {
                  memset(puVar17,0,uVar15);
                  puVar13 = puVar17 + (long)pFVar31->nColumn + 1;
                  local_120 = puVar13 + (long)pFVar31->nColumn + 1;
                }
              }
              else {
                local_128 = (sqlite_int64 *)0x0;
                local_120 = (u32 *)0x0;
                puVar13 = (u32 *)0x0;
                puVar17 = (u32 *)0x0;
              }
              if ((int)local_118.zTerm == 0) {
                local_128 = (sqlite_int64 *)0x0;
                do {
                  ppFVar8 = local_b8.apSegment;
                  iVar11 = sqlite3_step((sqlite3_stmt *)local_b8.apSegment);
                  if (iVar11 != 100) break;
                  iVar11 = langidFromSelect(pFVar31,(sqlite3_stmt *)ppFVar8);
                  pMVar18 = columnMem((sqlite3_stmt *)ppFVar8,0);
                  iVar19 = sqlite3VdbeIntValue(pMVar18);
                  columnMallocFailure((sqlite3_stmt *)ppFVar8);
                  iVar10 = fts3PendingTermsDocid(pFVar31,0,iVar11,iVar19);
                  local_118.zTerm = (char *)CONCAT44(local_118.zTerm._4_4_,iVar10);
                  memset(puVar17,0,(long)pFVar31->nColumn * 4 + 4);
                  if ((int)local_118.zTerm == 0) {
                    lVar21 = 0;
                    pnWord = puVar17;
                    do {
                      if (pFVar31->nColumn <= lVar21) break;
                      if (pFVar31->abNotindexed[lVar21] == '\0') {
                        iVar30 = (int)lVar21 + 1;
                        puVar20 = sqlite3_column_text((sqlite3_stmt *)local_b8.apSegment,iVar30);
                        iVar10 = fts3PendingTermsAdd(local_130,iVar11,(char *)puVar20,(int)lVar21,
                                                     pnWord);
                        pFVar31 = local_130;
                        local_118.zTerm = (char *)CONCAT44(local_118.zTerm._4_4_,iVar10);
                        iVar10 = sqlite3_column_bytes((sqlite3_stmt *)local_b8.apSegment,iVar30);
                        puVar17[pFVar31->nColumn] = puVar17[pFVar31->nColumn] + iVar10;
                      }
                      lVar21 = lVar21 + 1;
                      pnWord = pnWord + 1;
                    } while ((int)local_118.zTerm == 0);
                  }
                  if (pFVar31->bHasDocsize != '\0') {
                    fts3InsertDocsize((int *)&local_118,pFVar31,puVar17);
                  }
                  if ((int)local_118.zTerm == 0) {
                    local_128 = (sqlite_int64 *)(ulong)((int)local_128 + 1);
                    if (-1 < pFVar31->nColumn) {
                      lVar21 = -1;
                      do {
                        puVar13[lVar21 + 1] = puVar13[lVar21 + 1] + puVar17[lVar21 + 1];
                        lVar21 = lVar21 + 1;
                      } while (lVar21 < pFVar31->nColumn);
                    }
                  }
                  else {
                    sqlite3_finalize((sqlite3_stmt *)local_b8.apSegment);
                    local_b8.apSegment = (Fts3SegReader **)0x0;
                  }
                } while ((int)local_118.zTerm == 0);
              }
              if (pFVar31->bFts4 != '\0') {
                fts3UpdateDocTotals((int *)&local_118,pFVar31,puVar13,local_120,(int)local_128);
              }
              sqlite3_free(puVar17);
              if ((Vdbe *)local_b8.apSegment != (Vdbe *)0x0) {
                iVar11 = sqlite3_finalize((sqlite3_stmt *)local_b8.apSegment);
                if ((int)local_118.zTerm != 0) {
                  iVar11 = (int)local_118.zTerm;
                }
                local_118.zTerm = (char *)CONCAT44(local_118.zTerm._4_4_,iVar11);
              }
            }
            iVar11 = (int)local_118.zTerm;
            goto LAB_001bad5c;
          }
        }
        else if (iVar10 == 0xf) {
          lVar21 = 0xf;
          lVar27 = 0;
          pcVar28 = "integrity-check";
          pbVar25 = pbVar12;
          do {
            if ((ulong)*pbVar25 == 0) {
              pcVar28 = "integrity-check" + lVar27;
              goto LAB_001ba076;
            }
            if (""[*pbVar25] != ""[(byte)*pcVar28]) goto LAB_001ba076;
            pbVar25 = pbVar25 + 1;
            lVar27 = lVar27 + 1;
            pcVar28 = (char *)((byte *)pcVar28 + 1);
            lVar21 = lVar21 + -1;
          } while (lVar21 != 0);
          lVar21 = 0;
          pbVar25 = pbVar12 + 0xf;
          pcVar28 = (char *)(byte *)0x1e4893;
LAB_001ba076:
          if (((int)lVar21 < 1) || (""[*pbVar25] == ""[(byte)*pcVar28])) {
            local_c8 = (sqlite3_stmt *)0x0;
            local_d8 = (sqlite_int64 *)0x0;
            iVar10 = fts3SqlStmt(local_130,0x1b,&local_c8,(sqlite3_value **)0x0);
            pStmt_00 = local_c8;
            if (iVar10 == 0) {
              sqlite3_bind_int64(local_c8,1,(long)pFVar31->iPrevLangid);
              sqlite3_bind_int64(pStmt_00,2,(long)pFVar31->nIndex);
              iVar11 = sqlite3_step(pStmt_00);
              bVar32 = true;
              if (iVar11 == 100) {
                local_d8 = (sqlite_int64 *)0x0;
                do {
                  pMVar18 = columnMem(pStmt_00,0);
                  local_128 = (sqlite_int64 *)sqlite3VdbeIntValue(pMVar18);
                  columnMallocFailure(pStmt_00);
                  if (0 < pFVar31->nIndex) {
                    iVar11 = 0;
                    do {
                      local_118.zTerm = (char *)0x0;
                      local_118.nTerm = 0;
                      local_118.iCol = 0;
                      local_b8.apSegment = (Fts3SegReader **)0x0;
                      local_b8.nSegment = 0;
                      local_b8.nAdvance = 0;
                      local_b8.pFilter = (Fts3SegFilter *)0x0;
                      local_b8.aBuffer = (char *)0x0;
                      local_b8.nBuffer = 0;
                      local_b8.iColFilter = 0;
                      local_b8.bRestart = 0;
                      local_b8.nCost = 0;
                      local_b8.bLookup = 0;
                      local_b8._52_4_ = 0;
                      local_b8.zTerm = (char *)0x0;
                      local_b8.nTerm = 0;
                      local_b8._68_4_ = 0;
                      local_b8.aDoclist = (char *)0x0;
                      local_b8.nDoclist = 0;
                      local_b8._84_4_ = 0;
                      local_118.flags = 0x13;
                      local_118._20_4_ = 0;
                      iVar10 = fts3SegReaderCursor(pFVar31,(int)local_128,iVar11,-2,(char *)0x0,0,0,
                                                   1,&local_b8);
                      if (iVar10 == 0) {
                        local_b8.pFilter = &local_118;
                        iVar10 = fts3SegReaderStart(pFVar31,&local_b8,local_118.zTerm,
                                                    local_118.nTerm);
                      }
                      if ((iVar10 == 0) &&
                         (iVar10 = sqlite3Fts3SegReaderStep(pFVar31,&local_b8), iVar10 == 100)) {
                        local_120 = (u32 *)CONCAT44(local_120._4_4_,iVar11);
                        uVar14 = 0;
                        do {
                          pcVar28 = local_b8.aDoclist;
                          iVar11 = local_b8.nDoclist;
                          lVar21 = (long)local_b8.nDoclist;
                          local_e8 = (char *)0x0;
                          local_f8 = 0;
                          iVar10 = sqlite3Fts3GetVarint(local_b8.aDoclist,(sqlite_int64 *)&local_e8)
                          ;
                          if (iVar10 < iVar11) {
                            pcVar23 = pcVar28 + lVar21;
                            pcVar28 = pcVar28 + iVar10;
                            lVar21 = 0;
                            do {
                              local_f0 = 0;
                              iVar11 = sqlite3Fts3GetVarint(pcVar28,(sqlite_int64 *)&local_f0);
                              pcVar28 = pcVar28 + iVar11;
                              if (pcVar28 < pcVar23) {
                                if (local_f0 < 2) {
                                  local_f8 = 0;
                                  if (local_f0 == 0) {
                                    iVar11 = sqlite3Fts3GetVarint(pcVar28,(sqlite_int64 *)&local_f0)
                                    ;
                                    local_e8 = local_e8 + local_f0;
                                  }
                                  else {
                                    iVar11 = sqlite3Fts3GetVarint(pcVar28,(sqlite_int64 *)&local_f8)
                                    ;
                                  }
                                  pcVar28 = pcVar28 + iVar11;
                                  lVar21 = 0;
                                }
                                else {
                                  lVar21 = lVar21 + local_f0 + -2;
                                  uVar15 = fts3ChecksumEntry(local_b8.zTerm,local_b8.nTerm,
                                                             (int)local_128,(int)local_120,
                                                             (i64)local_e8,(int)local_f8,(int)lVar21
                                                            );
                                  uVar14 = uVar14 ^ uVar15;
                                }
                              }
                            } while (pcVar28 < pcVar23);
                          }
                          pFVar31 = local_130;
                          iVar10 = sqlite3Fts3SegReaderStep(local_130,&local_b8);
                        } while (iVar10 == 100);
                        iVar11 = (int)local_120;
                      }
                      else {
                        uVar14 = 0;
                      }
                      local_d8 = (sqlite_int64 *)((ulong)local_d8 ^ uVar14);
                      sqlite3Fts3SegReaderFinish(&local_b8);
                      iVar11 = iVar11 + 1;
                    } while (iVar11 < pFVar31->nIndex);
                  }
                  pStmt_00 = local_c8;
                  bVar32 = iVar10 == 0;
                  if (!bVar32) goto LAB_001ba813;
                  iVar11 = sqlite3_step(local_c8);
                } while (iVar11 == 100);
                bVar32 = true;
              }
              else {
                local_d8 = (sqlite_int64 *)0x0;
              }
LAB_001ba813:
              iVar11 = sqlite3_reset(local_c8);
              if (bVar32) {
                iVar10 = iVar11;
              }
            }
            if (iVar10 == 0) {
              local_60 = pFVar31->pTokenizer->pModule;
              local_b8.apSegment = (Fts3SegReader **)0x0;
              pcVar28 = sqlite3_mprintf("SELECT %s");
              if (pcVar28 == (char *)0x0) {
                iVar10 = 7;
              }
              else {
                iVar10 = sqlite3LockAndPrepare
                                   (pFVar31->db,pcVar28,-1,0x80,(Vdbe *)0x0,
                                    (sqlite3_stmt **)&local_b8,(char **)0x0);
                sqlite3_free(pcVar28);
              }
              if (iVar10 == 0) {
                local_128 = (sqlite_int64 *)0x0;
                local_58 = (Vdbe *)local_b8.apSegment;
                pStmt = (Vdbe *)local_b8.apSegment;
                do {
                  iVar11 = sqlite3_step((sqlite3_stmt *)pStmt);
                  if (iVar11 != 100) break;
                  pMVar18 = columnMem((sqlite3_stmt *)pStmt,0);
                  iVar19 = sqlite3VdbeIntValue(pMVar18);
                  columnMallocFailure((sqlite3_stmt *)pStmt);
                  iVar11 = langidFromSelect(pFVar31,(sqlite3_stmt *)pStmt);
                  if (iVar10 == 0) {
                    local_50 = (iVar19 * 9 + (long)iVar11) * 0x51;
                    lVar21 = 0;
                    local_e0 = iVar11;
                    local_38 = iVar19;
                    do {
                      if (pFVar31->nColumn <= lVar21) break;
                      if (pFVar31->abNotindexed[lVar21] == '\0') {
                        iVar10 = (int)lVar21 + 1;
                        local_d0 = lVar21;
                        puVar20 = sqlite3_column_text((sqlite3_stmt *)pStmt,iVar10);
                        iVar10 = sqlite3_column_bytes((sqlite3_stmt *)pStmt,iVar10);
                        local_118.zTerm = (char *)0x0;
                        iVar10 = sqlite3Fts3OpenTokenizer
                                           (pFVar31->pTokenizer,iVar11,(char *)puVar20,iVar10,
                                            (sqlite3_tokenizer_cursor **)&local_118);
                        if (iVar10 == 0) {
                          local_40 = (sqlite3_tokenizer_cursor *)local_118.zTerm;
                          local_48 = (local_50 + local_d0) * 9;
                          do {
                            local_f8 = local_f8 & 0xffffffff00000000;
                            local_f0 = local_f0 & 0xffffffff00000000;
                            local_bc = 0;
                            local_dc = 0;
                            iVar10 = (*local_60->xNext)(local_40,&local_e8,(int *)&local_f8,
                                                        (int *)&local_f0,&local_bc,&local_dc);
                            pcVar28 = local_e8;
                            if (iVar10 == 0) {
                              iVar11 = (int)local_f8;
                              local_120 = (u32 *)(long)local_dc;
                              uVar14 = local_48 + (long)local_120;
                              if (0 < (long)(int)local_f8) {
                                lVar21 = 0;
                                do {
                                  uVar14 = uVar14 * 9 + (long)local_e8[lVar21];
                                  lVar21 = lVar21 + 1;
                                } while ((int)local_f8 != lVar21);
                              }
                              local_128 = (sqlite_int64 *)((ulong)local_128 ^ uVar14);
                              iVar30 = local_130->nIndex;
                              if (1 < (long)iVar30) {
                                pFVar24 = local_130->aIndex;
                                lVar21 = 1;
                                do {
                                  pFVar24 = pFVar24 + 1;
                                  if (pFVar24->nPrefix <= iVar11) {
                                    uVar15 = fts3ChecksumEntry(pcVar28,pFVar24->nPrefix,local_e0,
                                                               (int)lVar21,local_38,(int)local_d0,
                                                               (int)local_120);
                                    local_128 = (sqlite_int64 *)((ulong)local_128 ^ uVar15);
                                  }
                                  lVar21 = lVar21 + 1;
                                } while (iVar30 != lVar21);
                              }
                            }
                            pStmt = local_58;
                          } while (iVar10 == 0);
                        }
                        pFVar31 = local_130;
                        if ((sqlite3_tokenizer_cursor *)local_118.zTerm !=
                            (sqlite3_tokenizer_cursor *)0x0) {
                          (*local_60->xClose)((sqlite3_tokenizer_cursor *)local_118.zTerm);
                        }
                        lVar21 = local_d0;
                        iVar11 = local_e0;
                        if (iVar10 == 0x65) {
                          iVar10 = 0;
                        }
                      }
                      lVar21 = lVar21 + 1;
                    } while (iVar10 == 0);
                  }
                } while (iVar10 == 0);
              }
              else {
                local_128 = (sqlite_int64 *)0x0;
              }
              sqlite3_finalize((sqlite3_stmt *)local_b8.apSegment);
              psVar16 = local_128;
            }
            else {
              psVar16 = (sqlite_int64 *)0x0;
            }
            iVar11 = 0x10b;
            if (local_d8 == psVar16) {
              iVar11 = iVar10;
            }
            if (iVar10 != 0) {
              iVar11 = iVar10;
            }
            goto LAB_001bad5c;
          }
        }
        else if (iVar10 == 8) {
          lVar21 = 8;
          lVar27 = 0;
          pcVar28 = "optimize";
          pbVar25 = pbVar12;
          do {
            if ((ulong)*pbVar25 == 0) {
              pcVar28 = "optimize" + lVar27;
              goto LAB_001b9ee6;
            }
            if (""[*pbVar25] != ""[(byte)*pcVar28]) goto LAB_001b9ee6;
            pbVar25 = pbVar25 + 1;
            lVar27 = lVar27 + 1;
            pcVar28 = (char *)((byte *)pcVar28 + 1);
            lVar21 = lVar21 + -1;
          } while (lVar21 != 0);
          lVar21 = 0;
          pbVar25 = pbVar12 + 8;
          pcVar28 = (char *)(byte *)0x1e0cc4;
LAB_001b9ee6:
          if (((int)lVar21 < 1) || (""[*pbVar25] == ""[(byte)*pcVar28])) {
            iVar11 = fts3DoOptimize(local_130,0);
            goto LAB_001bad5c;
          }
        }
        if (6 < iVar10) {
          pbVar25 = pbVar12 + 6;
          lVar21 = 6;
          lVar27 = 0;
          pbVar29 = (byte *)0x1e5f03;
          pbVar26 = pbVar12;
          do {
            if ((ulong)*pbVar26 == 0) {
              pbVar29 = (byte *)("automerge=" + lVar27 + 4);
              goto LAB_001ba513;
            }
            if (""[*pbVar26] != ""[*pbVar29]) goto LAB_001ba513;
            pbVar26 = pbVar26 + 1;
            lVar27 = lVar27 + 1;
            pbVar29 = pbVar29 + 1;
            lVar21 = lVar21 + -1;
          } while (lVar21 != 0);
          lVar21 = 0;
          pbVar26 = pbVar25;
          pbVar29 = (byte *)0x1e5f09;
LAB_001ba513:
          if (((int)lVar21 < 1) || (""[*pbVar26] == ""[*pbVar29])) {
            bVar9 = *pbVar25;
            iVar11 = 0;
            if ('/' < (char)bVar9) {
              iVar11 = 0;
              do {
                if ((0x39 < bVar9) || (0xcccccca < iVar11)) break;
                iVar11 = (uint)bVar9 + iVar11 * 10 + -0x30;
                bVar9 = pbVar25[1];
                pbVar25 = pbVar25 + 1;
              } while ('/' < (char)bVar9);
            }
            iVar10 = 8;
            if ((*pbVar25 == 0x2c) && (bVar9 = pbVar25[1], bVar9 != 0)) {
              pbVar25 = pbVar25 + 1;
              iVar10 = 0;
              if ('/' < (char)bVar9) {
                iVar10 = 0;
                do {
                  if ((0x39 < bVar9) || (0xcccccca < iVar10)) break;
                  iVar10 = (uint)bVar9 + iVar10 * 10 + -0x30;
                  bVar9 = pbVar25[1];
                  pbVar25 = pbVar25 + 1;
                } while ('/' < (char)bVar9);
              }
            }
            if ((*pbVar25 == 0) && (1 < iVar10)) {
              local_b8.apSegment = (Fts3SegReader **)((ulong)local_b8.apSegment._4_4_ << 0x20);
              if (local_130->bHasStat == '\0') {
                sqlite3Fts3CreateStatTable((int *)&local_b8,local_130);
              }
              if ((int)local_b8.apSegment == 0) {
                iVar11 = sqlite3Fts3Incrmerge(local_130,iVar11,iVar10);
                local_b8.apSegment = (Fts3SegReader **)CONCAT44(local_b8.apSegment._4_4_,iVar11);
              }
              pFVar31 = local_130;
              sqlite3_blob_close(local_130->pSegments);
              pFVar31->pSegments = (sqlite3_blob *)0x0;
            }
            else {
              local_b8.apSegment = (Fts3SegReader **)CONCAT44(local_b8.apSegment._4_4_,1);
            }
            iVar11 = (int)local_b8.apSegment;
            goto LAB_001bad5c;
          }
        }
        iVar11 = 1;
        if (10 < iVar10) {
          lVar21 = 10;
          lVar27 = 0;
          pcVar28 = "automerge=";
          pbVar25 = pbVar12;
          do {
            if ((ulong)*pbVar25 == 0) {
              pcVar28 = "automerge=" + lVar27;
              goto LAB_001ba69a;
            }
            if (""[*pbVar25] != ""[(byte)*pcVar28]) goto LAB_001ba69a;
            pbVar25 = pbVar25 + 1;
            lVar27 = lVar27 + 1;
            pcVar28 = (char *)((byte *)pcVar28 + 1);
            lVar21 = lVar21 + -1;
          } while (lVar21 != 0);
          lVar21 = 0;
          pbVar25 = pbVar12 + 10;
          pcVar28 = (char *)(byte *)0x1e5f09;
LAB_001ba69a:
          if (((int)lVar21 < 1) || (""[*pbVar25] == ""[(byte)*pcVar28])) {
            local_118.zTerm = (char *)((ulong)local_118.zTerm & 0xffffffff00000000);
            local_b8.apSegment = (Fts3SegReader **)0x0;
            bVar9 = pbVar12[10];
            iVar11 = 0;
            if ('/' < (char)bVar9) {
              pbVar12 = pbVar12 + 0xb;
              iVar11 = 0;
              do {
                if ((0x39 < bVar9) || (0xcccccca < iVar11)) break;
                iVar11 = (uint)bVar9 + iVar11 * 10 + -0x30;
                bVar9 = *pbVar12;
                pbVar12 = pbVar12 + 1;
              } while ('/' < (char)bVar9);
            }
            iVar10 = iVar11;
            if (0x10 < iVar11) {
              iVar10 = 8;
            }
            if (iVar11 == 1) {
              iVar10 = 8;
            }
            local_130->nAutoincrmerge = iVar10;
            if (local_130->bHasStat == '\0') {
              sqlite3Fts3CreateStatTable((int *)&local_118,local_130);
              iVar11 = (int)local_118.zTerm;
              if ((int)local_118.zTerm != 0) goto LAB_001bad5c;
            }
            iVar11 = fts3SqlStmt(pFVar31,0x17,(sqlite3_stmt **)&local_b8,(sqlite3_value **)0x0);
            ppFVar8 = local_b8.apSegment;
            local_118.zTerm = (char *)CONCAT44(local_118.zTerm._4_4_,iVar11);
            if (iVar11 == 0) {
              sqlite3_bind_int64((sqlite3_stmt *)local_b8.apSegment,1,2);
              sqlite3_bind_int64((sqlite3_stmt *)ppFVar8,2,(long)pFVar31->nAutoincrmerge);
              sqlite3_step((sqlite3_stmt *)ppFVar8);
              iVar11 = sqlite3_reset((sqlite3_stmt *)ppFVar8);
              local_118.zTerm = (char *)CONCAT44(local_118.zTerm._4_4_,iVar11);
            }
          }
        }
      }
    }
  }
LAB_001bad5c:
  local_134 = iVar11;
  puVar17 = (u32 *)0x0;
LAB_001bad5f:
  sqlite3_free(puVar17);
  pFVar31 = local_130;
  sqlite3_blob_close(local_130->pSegments);
  pFVar31->pSegments = (sqlite3_blob *)0x0;
  return local_134;
}

Assistant:

static int fts3UpdateMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  int nArg,                       /* Size of argument array */
  sqlite3_value **apVal,          /* Array of arguments */
  sqlite_int64 *pRowid            /* OUT: The affected (or effected) rowid */
){
  return sqlite3Fts3UpdateMethod(pVtab, nArg, apVal, pRowid);
}